

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<unsigned_int,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::ModulusSimpleCase(uint lhs,
                        SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        rhs,SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            *result)

{
  bool bVar1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDX;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_ESI;
  undefined4 in_EDI;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  SVar2.m_int = in_ESI.m_int;
  bVar1 = ::operator!=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,0x1ae924);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::SignedCase(in_ESI,in_RDX);
    if (!bVar1) {
      ::SafeInt::operator_cast_to_unsigned_int
                ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(SVar2.m_int,in_ESI.m_int));
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_EDI,in_stack_fffffffffffffff0),&in_RDX->m_int);
    }
    return true;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }